

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# squall_call.hpp
# Opt level: O0

void squall::detail::call_setup<>(HSQUIRRELVM vm,HSQOBJECT *table,string *name)

{
  HSQOBJECT obj;
  HSQOBJECT obj_00;
  SQRESULT SVar1;
  squirrel_error *psVar2;
  SQInteger in_stack_ffffffffffffff48;
  HSQUIRRELVM in_stack_ffffffffffffff50;
  HSQUIRRELVM pSVar3;
  HSQUIRRELVM in_stack_ffffffffffffff70;
  SQChar *in_stack_ffffffffffffff78;
  SQObjectValue in_stack_ffffffffffffff80;
  SQBool in_stack_ffffffffffffff88;
  SQInteger params;
  string local_50 [32];
  undefined8 local_30;
  SQObjectValue local_28;
  string *local_20;
  string *name_local;
  HSQOBJECT *table_local;
  HSQUIRRELVM vm_local;
  
  local_30 = *(undefined8 *)table;
  local_28 = table->_unVal;
  obj._unVal.pTable = in_stack_ffffffffffffff80.pTable;
  obj._0_8_ = in_stack_ffffffffffffff78;
  local_20 = name;
  name_local = (string *)table;
  table_local = (HSQOBJECT *)vm;
  sq_pushobject(in_stack_ffffffffffffff70,obj);
  pSVar3 = (HSQUIRRELVM)table_local;
  std::__cxx11::string::data();
  std::__cxx11::string::length();
  sq_pushstring((HSQUIRRELVM)in_stack_ffffffffffffff80.pTable,in_stack_ffffffffffffff78,
                (SQInteger)in_stack_ffffffffffffff70);
  SVar1 = sq_get(pSVar3,(SQInteger)in_stack_ffffffffffffff50);
  if (SVar1 < 0) {
    psVar2 = (squirrel_error *)__cxa_allocate_exception(0x10);
    std::operator+((char *)local_50,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   "can\'t find such function: ");
    squirrel_error::squirrel_error(psVar2,local_50);
    __cxa_throw(psVar2,&squirrel_error::typeinfo,squirrel_error::~squirrel_error);
  }
  sq_remove(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
  params = *(SQInteger *)name_local;
  pSVar3 = *(HSQUIRRELVM *)(name_local + 8);
  obj_00._unVal.pTable = in_stack_ffffffffffffff80.pTable;
  obj_00._0_8_ = in_stack_ffffffffffffff78;
  sq_pushobject(in_stack_ffffffffffffff70,obj_00);
  call_setup_arg((HSQUIRRELVM)table_local);
  SVar1 = sq_call(pSVar3,params,in_stack_ffffffffffffff88,in_stack_ffffffffffffff80.nInteger);
  if (SVar1 < 0) {
    psVar2 = (squirrel_error *)__cxa_allocate_exception(0x10);
    std::operator+(&stack0xffffffffffffff70,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   "function call failed: ");
    squirrel_error::squirrel_error(psVar2,(string *)&stack0xffffffffffffff70);
    __cxa_throw(psVar2,&squirrel_error::typeinfo,squirrel_error::~squirrel_error);
  }
  return;
}

Assistant:

inline
void call_setup(HSQUIRRELVM vm, const HSQOBJECT& table,
                const string& name, T... args) {

    sq_pushobject(vm, table);
    sq_pushstring(vm, name.data(), name.length());
    if (!SQ_SUCCEEDED(sq_get(vm, -2))) {
        throw squirrel_error(_SC("can't find such function: ") + name);
    }

    sq_remove(vm, -2);
    sq_pushobject(vm, table);
    call_setup_arg(vm, args...);
    if (!SQ_SUCCEEDED(sq_call(vm, sizeof...(args)+1, SQTrue, SQTrue))) {
        throw squirrel_error(_SC("function call failed: ") + name);
    }
}